

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O3

void __thiscall
google::protobuf::io::Tokenizer::ConsumeBlockComment(Tokenizer *this,string *content)

{
  int iVar1;
  byte bVar2;
  ulong uVar3;
  size_type sVar4;
  long *local_58;
  undefined8 local_50;
  long local_48 [2];
  uint local_34;
  
  iVar1 = this->column_;
  if (content != (string *)0x0) {
    this->record_target_ = content;
    this->record_start_ = this->buffer_pos_;
  }
  local_34 = this->line_;
LAB_00234581:
  do {
    bVar2 = this->current_char_;
    if (bVar2 < 0x2a) {
      if (bVar2 != 0) {
        if (bVar2 == 10) {
          NextChar(this);
          if (content != (string *)0x0) {
            if (this->buffer_pos_ != this->record_start_) {
              std::__cxx11::string::append
                        ((char *)this->record_target_,(ulong)(this->buffer_ + this->record_start_));
            }
            this->record_target_ = (string *)0x0;
            this->record_start_ = -1;
          }
          while (uVar3 = (ulong)(byte)this->current_char_, uVar3 < 0x2b) {
            if ((0x100003a00U >> (uVar3 & 0x3f) & 1) == 0) {
              if ((uVar3 == 0x2a) && (NextChar(this), this->current_char_ == '/')) {
                NextChar(this);
                return;
              }
              break;
            }
            NextChar(this);
          }
          if (content != (string *)0x0) {
            this->record_target_ = content;
            this->record_start_ = this->buffer_pos_;
          }
        }
        else {
LAB_002346bf:
          NextChar(this);
        }
        goto LAB_00234581;
      }
    }
    else if (bVar2 == 0x2a) {
      NextChar(this);
      bVar2 = this->current_char_;
      if (bVar2 == 0x2f) {
        NextChar(this);
        if (content == (string *)0x0) {
          return;
        }
        if (this->buffer_pos_ != this->record_start_) {
          std::__cxx11::string::append
                    ((char *)this->record_target_,(ulong)(this->buffer_ + this->record_start_));
        }
        this->record_target_ = (string *)0x0;
        this->record_start_ = -1;
        sVar4 = content->_M_string_length - 2;
        if (1 < content->_M_string_length) {
          content->_M_string_length = sVar4;
          (content->_M_dataplus)._M_p[sVar4] = '\0';
          return;
        }
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
      }
    }
    else {
      if (bVar2 != 0x2f) goto LAB_002346bf;
      NextChar(this);
      bVar2 = this->current_char_;
      if (bVar2 == 0x2a) {
        local_58 = local_48;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,
                   "\"/*\" inside block comment.  Block comments cannot be nested.","");
        (*this->error_collector_->_vptr_ErrorCollector[2])
                  (this->error_collector_,(ulong)(uint)this->line_,(ulong)(uint)this->column_,
                   local_50,local_58);
        if (local_58 != local_48) {
          operator_delete(local_58,local_48[0] + 1);
        }
        goto LAB_00234581;
      }
    }
    if (bVar2 == 0) {
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"End-of-file inside block comment.","");
      (*this->error_collector_->_vptr_ErrorCollector[2])
                (this->error_collector_,(ulong)(uint)this->line_,(ulong)(uint)this->column_,local_50
                 ,local_58);
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
      (*this->error_collector_->_vptr_ErrorCollector[2])
                (this->error_collector_,(ulong)local_34,(ulong)(iVar1 - 2),0x17,
                 "  Comment started here.");
      if (content != (string *)0x0) {
        if (this->buffer_pos_ != this->record_start_) {
          std::__cxx11::string::append
                    ((char *)this->record_target_,(ulong)(this->buffer_ + this->record_start_));
        }
        this->record_target_ = (string *)0x0;
        this->record_start_ = -1;
      }
      return;
    }
  } while( true );
}

Assistant:

void Tokenizer::ConsumeBlockComment(std::string* content) {
  int start_line = line_;
  int start_column = column_ - 2;

  if (content != nullptr) RecordTo(content);

  while (true) {
    while (current_char_ != '\0' && current_char_ != '*' &&
           current_char_ != '/' && current_char_ != '\n') {
      NextChar();
    }

    if (TryConsume('\n')) {
      if (content != nullptr) StopRecording();

      // Consume leading whitespace and asterisk;
      ConsumeZeroOrMore<WhitespaceNoNewline>();
      if (TryConsume('*')) {
        if (TryConsume('/')) {
          // End of comment.
          break;
        }
      }

      if (content != nullptr) RecordTo(content);
    } else if (TryConsume('*') && TryConsume('/')) {
      // End of comment.
      if (content != nullptr) {
        StopRecording();
        // Strip trailing "*/".
        content->erase(content->size() - 2);
      }
      break;
    } else if (TryConsume('/') && current_char_ == '*') {
      // Note:  We didn't consume the '*' because if there is a '/' after it
      //   we want to interpret that as the end of the comment.
      AddError(
          "\"/*\" inside block comment.  Block comments cannot be nested.");
    } else if (current_char_ == '\0') {
      AddError("End-of-file inside block comment.");
      error_collector_->RecordError(start_line, start_column,
                                    "  Comment started here.");
      if (content != nullptr) StopRecording();
      break;
    }
  }
}